

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_cas_32_aw(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
    return;
  }
  uVar2 = m68ki_read_imm_16();
  uVar3 = m68ki_read_imm_16();
  uVar4 = m68ki_read_32_fc((int)(short)uVar3,m68ki_address_space | m68ki_cpu.s_flag);
  uVar1 = m68ki_cpu.dar[uVar2 & 7];
  uVar5 = uVar4 - uVar1;
  m68ki_cpu.n_flag = uVar5 >> 0x18;
  m68ki_cpu.v_flag = ((uVar5 ^ uVar4) & (uVar1 ^ uVar4)) >> 0x18;
  m68ki_cpu.c_flag = ((uVar5 | uVar1) & ~uVar4 | uVar5 & uVar1) >> 0x17;
  m68ki_cpu.not_z_flag = uVar4 - uVar1;
  if (m68ki_cpu.not_z_flag == 0) {
    m68ki_remaining_cycles = m68ki_remaining_cycles + -3;
    m68ki_write_32_fc((int)(short)uVar3,m68ki_cpu.s_flag | 1,
                      *(uint *)((long)m68ki_cpu.dar + (ulong)(uVar2 >> 4 & 0x1c)));
    return;
  }
  m68ki_cpu.dar[uVar2 & 7] = uVar4;
  return;
}

Assistant:

static void m68k_op_cas_32_aw(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		uint ea = EA_AW_32();
		uint dest = m68ki_read_32(ea);
		uint* compare = &REG_D[word2 & 7];
		uint res = dest - *compare;

		m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
		FLAG_N = NFLAG_32(res);
		FLAG_Z = MASK_OUT_ABOVE_32(res);
		FLAG_V = VFLAG_SUB_32(*compare, dest, res);
		FLAG_C = CFLAG_SUB_32(*compare, dest, res);

		if(COND_NE())
			*compare = dest;
		else
		{
			USE_CYCLES(3);
			m68ki_write_32(ea, REG_D[(word2 >> 6) & 7]);
		}
		return;
	}
	m68ki_exception_illegal();
}